

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

int __thiscall llvm::APInt::compareSigned(APInt *this,APInt *RHS)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  
  uVar3 = this->BitWidth;
  if (uVar3 != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be same for comparison\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x11b,"int llvm::APInt::compareSigned(const APInt &) const");
  }
  if (uVar3 < 0x41) {
    if (uVar3 == 0) {
      __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
    }
    bVar5 = -(char)uVar3;
    lVar4 = (long)((this->U).VAL << (bVar5 & 0x3f)) >> (bVar5 & 0x3f);
    lVar6 = (long)((RHS->U).VAL << (bVar5 & 0x3f)) >> (bVar5 & 0x3f);
    uVar3 = 0xffffffff;
    if (lVar6 <= lVar4) {
      uVar3 = (uint)(lVar6 < lVar4);
    }
  }
  else {
    bVar1 = operator[](this,uVar3 - 1);
    bVar2 = operator[](RHS,RHS->BitWidth - 1);
    if (bVar1 == bVar2) {
      uVar7 = (ulong)this->BitWidth + 0x3f >> 6;
      do {
        bVar1 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar1) {
          return 0;
        }
      } while ((this->U).pVal[uVar7] == (RHS->U).pVal[uVar7]);
      uVar3 = ((RHS->U).pVal[uVar7] < (this->U).pVal[uVar7]) - 1;
    }
    else {
      uVar3 = -(uint)bVar1;
    }
    uVar3 = uVar3 | 1;
  }
  return uVar3;
}

Assistant:

int APInt::compareSigned(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be same for comparison");
  if (isSingleWord()) {
    int64_t lhsSext = SignExtend64(U.VAL, BitWidth);
    int64_t rhsSext = SignExtend64(RHS.U.VAL, BitWidth);
    return lhsSext < rhsSext ? -1 : lhsSext > rhsSext;
  }

  bool lhsNeg = isNegative();
  bool rhsNeg = RHS.isNegative();

  // If the sign bits don't match, then (LHS < RHS) if LHS is negative
  if (lhsNeg != rhsNeg)
    return lhsNeg ? -1 : 1;

  // Otherwise we can just use an unsigned comparison, because even negative
  // numbers compare correctly this way if both have the same signed-ness.
  return tcCompare(U.pVal, RHS.U.pVal, getNumWords());
}